

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder.c
# Opt level: O3

void av1_visit_palette(AV1Decoder *pbi,MACROBLOCKD *xd,aom_reader *r,palette_visitor_fn_t visit)

{
  bool bVar1;
  bool bVar2;
  long lVar3;
  
  if ((((*xd->mi)->field_0xa7 & 0x80) == 0) && ((*xd->mi)->ref_frame[0] < '\x01')) {
    bVar2 = true;
    lVar3 = 0;
    do {
      if ((!bVar2) && (xd->is_chroma_ref != true)) {
        return;
      }
      if (((*xd->mi)->palette_mode_info).palette_size[lVar3] != '\0') {
        (*visit)(xd,(int)lVar3,r);
      }
      lVar3 = 1;
      bVar1 = (bool)(((pbi->common).seq_params)->monochrome == '\0' & bVar2);
      bVar2 = false;
    } while (bVar1);
  }
  return;
}

Assistant:

void av1_visit_palette(AV1Decoder *const pbi, MACROBLOCKD *const xd,
                       aom_reader *r, palette_visitor_fn_t visit) {
  if (!is_inter_block(xd->mi[0])) {
    for (int plane = 0; plane < AOMMIN(2, av1_num_planes(&pbi->common));
         ++plane) {
      if (plane == 0 || xd->is_chroma_ref) {
        if (xd->mi[0]->palette_mode_info.palette_size[plane])
          visit(xd, plane, r);
      } else {
        assert(xd->mi[0]->palette_mode_info.palette_size[plane] == 0);
      }
    }
  }
}